

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  long *ilimit_w;
  undefined8 *puVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  BYTE *iStart;
  long *plVar12;
  size_t sVar13;
  uint *puVar14;
  BYTE *pBVar15;
  seqDef *psVar16;
  byte bVar17;
  U32 UVar18;
  U32 UVar19;
  long *plVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  uint uVar23;
  long lVar24;
  U32 UVar25;
  int iVar26;
  BYTE *litEnd;
  uint uVar27;
  U32 UVar28;
  BYTE *pBVar29;
  long *plVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  U32 *pUVar37;
  U32 UVar38;
  bool bVar39;
  ulong local_128;
  ulong local_120;
  ulong local_110;
  ulong local_f0;
  BYTE *local_c8;
  U32 *local_c0;
  long *local_b8;
  U32 maxDistance;
  BYTE *litLimit_w;
  
  pBVar5 = (ms->window).base;
  pBVar6 = (ms->window).dictBase;
  uVar3 = (ms->window).dictLimit;
  iStart = pBVar5 + uVar3;
  pBVar29 = pBVar6 + uVar3;
  uVar4 = (ms->window).lowLimit;
  UVar38 = *rep;
  plVar30 = (long *)((ulong)(iStart == (BYTE *)src) + (long)src);
  uVar8 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar25 = rep[1];
  iEnd = (BYTE *)(srcSize + (long)src);
  plVar12 = (long *)((long)src + (srcSize - 8));
  ilimit_w = (long *)((long)src + (srcSize - 0x20));
  iVar9 = uVar3 - 1;
LAB_001d55a1:
  do {
    if (plVar12 <= plVar30) {
      *rep = UVar38;
      rep[1] = UVar25;
      return (long)iEnd - (long)src;
    }
    iVar36 = (int)plVar30 - (int)pBVar5;
    iVar10 = iVar36 + 1;
    UVar28 = (ms->window).lowLimit;
    UVar19 = ms->loadedDictEnd;
    UVar18 = iVar10 - uVar8;
    if (iVar10 - UVar28 <= uVar8) {
      UVar18 = UVar28;
    }
    if (UVar19 != 0) {
      UVar18 = UVar28;
    }
    uVar11 = iVar10 - UVar38;
    pBVar15 = pBVar5;
    if (uVar11 < uVar3) {
      pBVar15 = pBVar6;
    }
    if (iVar9 - uVar11 < 3) {
LAB_001d5675:
      local_128 = 0;
    }
    else {
      local_128 = 0;
      if (UVar38 < (iVar36 - UVar18) + 1) {
        if (*(int *)((long)plVar30 + 1) != *(int *)(pBVar15 + uVar11)) goto LAB_001d5675;
        pBVar22 = iEnd;
        if (uVar11 < uVar3) {
          pBVar22 = pBVar29;
        }
        sVar13 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar30 + 5),(BYTE *)((long)(pBVar15 + uVar11) + 4),iEnd,
                            pBVar22,iStart);
        local_128 = sVar13 + 4;
      }
    }
    uVar11 = (ms->cParams).minMatch;
    if (uVar11 - 6 < 2) {
      bVar2 = (byte)(ms->cParams).chainLog;
      uVar27 = 1 << (bVar2 & 0x1f);
      local_c8 = (ms->window).base;
      pBVar15 = (ms->window).dictBase;
      uVar11 = (ms->window).dictLimit;
      local_f0 = (long)plVar30 - (long)local_c8;
      uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar32 = (uint)local_f0;
      UVar18 = uVar32 - uVar23;
      if (uVar32 - UVar28 <= uVar23) {
        UVar18 = UVar28;
      }
      local_c0 = ms->chainTable;
      if (UVar19 != 0) {
        UVar18 = UVar28;
      }
      uVar23 = (ms->cParams).searchLog;
      pUVar37 = ms->hashTable;
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      for (uVar31 = (ulong)ms->nextToUpdate; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1)
      {
        uVar34 = (ulong)(*(long *)(local_c8 + uVar31) * -0x30e4432340650000) >> (bVar17 & 0x3f);
        local_c0[(uint)uVar31 & ~(-1 << (bVar2 & 0x1f))] = pUVar37[uVar34];
        pUVar37[uVar34] = (uint)uVar31;
      }
      uVar33 = uVar32 - uVar27;
      if (uVar32 < uVar27) {
        uVar33 = 0;
      }
      iVar10 = 1 << ((byte)uVar23 & 0x1f);
      ms->nextToUpdate = uVar32;
      lVar24 = *plVar30;
      puVar14 = pUVar37 + ((ulong)(lVar24 * -0x30e4432340650000) >> (bVar17 & 0x3f));
      local_120 = 999999999;
      uVar31 = 3;
      while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, uVar34 = uVar31, bVar39) {
        uVar23 = *puVar14;
        if (uVar23 < UVar18) break;
        if (uVar23 < uVar11) {
          if (*(int *)(pBVar15 + uVar23) == (int)lVar24) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar30 + 4),pBVar15 + (ulong)uVar23 + 4,iEnd,
                                pBVar15 + uVar11,local_c8 + uVar11);
            uVar34 = sVar13 + 4;
LAB_001d58fb:
            if ((uVar31 < uVar34) &&
               (local_120 = (ulong)((uVar32 + 2) - uVar23), uVar31 = uVar34,
               (BYTE *)((long)plVar30 + uVar34) == iEnd)) break;
          }
        }
        else if ((local_c8 + uVar23)[uVar31] == *(BYTE *)((long)plVar30 + uVar31)) {
          uVar34 = ZSTD_count((BYTE *)plVar30,local_c8 + uVar23,iEnd);
          goto LAB_001d58fb;
        }
        uVar34 = uVar31;
        if (uVar23 <= uVar33) break;
        puVar14 = local_c0 + (uVar23 & uVar27 - 1);
      }
    }
    else if (uVar11 == 5) {
      bVar2 = (byte)(ms->cParams).chainLog;
      uVar27 = 1 << (bVar2 & 0x1f);
      local_c8 = (ms->window).base;
      pBVar15 = (ms->window).dictBase;
      uVar11 = (ms->window).dictLimit;
      local_f0 = (long)plVar30 - (long)local_c8;
      uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar32 = (uint)local_f0;
      UVar18 = uVar32 - uVar23;
      if (uVar32 - UVar28 <= uVar23) {
        UVar18 = UVar28;
      }
      local_c0 = ms->chainTable;
      if (UVar19 != 0) {
        UVar18 = UVar28;
      }
      uVar23 = (ms->cParams).searchLog;
      pUVar37 = ms->hashTable;
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      for (uVar31 = (ulong)ms->nextToUpdate; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1)
      {
        uVar34 = (ulong)(*(long *)(local_c8 + uVar31) * -0x30e4432345000000) >> (bVar17 & 0x3f);
        local_c0[(uint)uVar31 & ~(-1 << (bVar2 & 0x1f))] = pUVar37[uVar34];
        pUVar37[uVar34] = (uint)uVar31;
      }
      uVar33 = uVar32 - uVar27;
      if (uVar32 < uVar27) {
        uVar33 = 0;
      }
      iVar10 = 1 << ((byte)uVar23 & 0x1f);
      ms->nextToUpdate = uVar32;
      lVar24 = *plVar30;
      puVar14 = pUVar37 + ((ulong)(lVar24 * -0x30e4432345000000) >> (bVar17 & 0x3f));
      local_120 = 999999999;
      uVar31 = 3;
      while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, uVar34 = uVar31, bVar39) {
        uVar23 = *puVar14;
        if (uVar23 < UVar18) break;
        if (uVar23 < uVar11) {
          if (*(int *)(pBVar15 + uVar23) == (int)lVar24) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar30 + 4),pBVar15 + (ulong)uVar23 + 4,iEnd,
                                pBVar15 + uVar11,local_c8 + uVar11);
            uVar34 = sVar13 + 4;
LAB_001d5ae1:
            if ((uVar31 < uVar34) &&
               (local_120 = (ulong)((uVar32 + 2) - uVar23), uVar31 = uVar34,
               (BYTE *)((long)plVar30 + uVar34) == iEnd)) break;
          }
        }
        else if ((local_c8 + uVar23)[uVar31] == *(BYTE *)((long)plVar30 + uVar31)) {
          uVar34 = ZSTD_count((BYTE *)plVar30,local_c8 + uVar23,iEnd);
          goto LAB_001d5ae1;
        }
        uVar34 = uVar31;
        if (uVar23 <= uVar33) break;
        puVar14 = local_c0 + (uVar23 & uVar27 - 1);
      }
    }
    else {
      bVar2 = (byte)(ms->cParams).chainLog;
      uVar27 = 1 << (bVar2 & 0x1f);
      local_c8 = (ms->window).base;
      pBVar15 = (ms->window).dictBase;
      uVar11 = (ms->window).dictLimit;
      local_f0 = (long)plVar30 - (long)local_c8;
      uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar32 = (uint)local_f0;
      UVar18 = uVar32 - uVar23;
      if (uVar32 - UVar28 <= uVar23) {
        UVar18 = UVar28;
      }
      local_c0 = ms->chainTable;
      if (UVar19 != 0) {
        UVar18 = UVar28;
      }
      uVar23 = (ms->cParams).searchLog;
      pUVar37 = ms->hashTable;
      bVar17 = 0x20 - (char)(ms->cParams).hashLog;
      for (uVar31 = (ulong)ms->nextToUpdate; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1)
      {
        uVar33 = (uint)(*(int *)(local_c8 + uVar31) * -0x61c8864f) >> (bVar17 & 0x1f);
        local_c0[(uint)uVar31 & ~(-1 << (bVar2 & 0x1f))] = pUVar37[uVar33];
        pUVar37[uVar33] = (uint)uVar31;
      }
      uVar33 = uVar32 - uVar27;
      if (uVar32 < uVar27) {
        uVar33 = 0;
      }
      iVar10 = 1 << ((byte)uVar23 & 0x1f);
      ms->nextToUpdate = uVar32;
      lVar24 = *plVar30;
      puVar14 = pUVar37 + ((uint)((int)lVar24 * -0x61c8864f) >> (bVar17 & 0x1f));
      local_120 = 999999999;
      uVar31 = 3;
      while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, uVar34 = uVar31, bVar39) {
        uVar23 = *puVar14;
        if (uVar23 < UVar18) break;
        if (uVar23 < uVar11) {
          if (*(int *)(pBVar15 + uVar23) == (int)lVar24) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar30 + 4),pBVar15 + (ulong)uVar23 + 4,iEnd,
                                pBVar15 + uVar11,local_c8 + uVar11);
            uVar34 = sVar13 + 4;
LAB_001d5c10:
            if ((uVar31 < uVar34) &&
               (local_120 = (ulong)((uVar32 + 2) - uVar23), uVar31 = uVar34,
               (BYTE *)((long)plVar30 + uVar34) == iEnd)) break;
          }
        }
        else if ((local_c8 + uVar23)[uVar31] == *(BYTE *)((long)plVar30 + uVar31)) {
          uVar34 = ZSTD_count((BYTE *)plVar30,local_c8 + uVar23,iEnd);
          goto LAB_001d5c10;
        }
        uVar34 = uVar31;
        if (uVar23 <= uVar33) break;
        puVar14 = local_c0 + (uVar23 & uVar27 - 1);
      }
    }
    uVar31 = local_128;
    if (local_128 < uVar34) {
      uVar31 = uVar34;
    }
    if (uVar31 < 4) {
      plVar30 = (long *)((long)plVar30 + ((long)plVar30 - (long)src >> 8) + 1);
      goto LAB_001d55a1;
    }
    plVar20 = plVar30;
    if (uVar34 <= local_128) {
      local_120 = 0;
      plVar20 = (long *)((long)plVar30 + 1);
    }
    do {
      uVar34 = uVar31;
      local_110 = local_120;
      local_b8 = plVar20;
      if (plVar12 <= plVar30) break;
      plVar20 = (long *)((long)plVar30 + 1);
      iVar36 = iVar36 + 1;
      if (local_120 == 0) {
        local_110 = 0;
      }
      else {
        UVar28 = (ms->window).lowLimit;
        UVar19 = iVar36 - uVar8;
        if (iVar36 - UVar28 <= uVar8) {
          UVar19 = UVar28;
        }
        if (ms->loadedDictEnd != 0) {
          UVar19 = UVar28;
        }
        uVar11 = iVar36 - UVar38;
        pBVar22 = pBVar5;
        if (uVar11 < uVar3) {
          pBVar22 = pBVar6;
        }
        if (iVar9 - uVar11 < 3) {
LAB_001d5e68:
        }
        else if ((UVar38 < iVar36 - UVar19) && (*(int *)plVar20 == *(int *)(pBVar22 + uVar11))) {
          pBVar21 = iEnd;
          if (uVar11 < uVar3) {
            pBVar21 = pBVar29;
          }
          sVar13 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar30 + 5),(BYTE *)((long)(pBVar22 + uVar11) + 4),
                              iEnd,pBVar21,iStart);
          if (0xfffffffffffffffb < sVar13) goto LAB_001d5e68;
          uVar23 = (int)local_120 + 1;
          uVar11 = 0x1f;
          if (uVar23 != 0) {
            for (; uVar23 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
          if ((int)((uVar11 ^ 0x1f) + (int)uVar34 * 3 + -0x1e) < (int)(sVar13 + 4) * 3) {
            local_110 = 0;
            uVar34 = sVar13 + 4;
            local_b8 = plVar20;
          }
        }
        else {
        }
      }
      uVar11 = (ms->cParams).minMatch;
      uVar31 = local_f0 & 0xffffffff;
      if (uVar11 - 6 < 2) {
        bVar2 = (byte)(ms->cParams).chainLog;
        uVar23 = 1 << (bVar2 & 0x1f);
        uVar11 = (ms->window).dictLimit;
        UVar28 = (ms->window).lowLimit;
        local_f0 = (long)plVar20 - (long)local_c8;
        uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar32 = (uint)local_f0;
        UVar19 = uVar32 - uVar27;
        if (uVar32 - UVar28 <= uVar27) {
          UVar19 = UVar28;
        }
        if (ms->loadedDictEnd != 0) {
          UVar19 = UVar28;
        }
        uVar27 = (ms->cParams).searchLog;
        bVar17 = 0x40 - (char)(ms->cParams).hashLog;
        for (; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1) {
          uVar35 = (ulong)(*(long *)(local_c8 + uVar31) * -0x30e4432340650000) >> (bVar17 & 0x3f);
          local_c0[(uint)uVar31 & ~(-1 << (bVar2 & 0x1f))] = pUVar37[uVar35];
          pUVar37[uVar35] = (uint)uVar31;
        }
        uVar33 = uVar32 - uVar23;
        if (uVar32 < uVar23) {
          uVar33 = 0;
        }
        iVar10 = 1 << ((byte)uVar27 & 0x1f);
        ms->nextToUpdate = uVar32;
        lVar24 = *(long *)((long)plVar30 + 1);
        puVar14 = pUVar37 + ((ulong)(lVar24 * -0x30e4432340650000) >> (bVar17 & 0x3f));
        local_120 = 999999999;
        uVar35 = 3;
        while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, uVar31 = uVar35, bVar39) {
          uVar27 = *puVar14;
          if (uVar27 < UVar19) break;
          if (uVar27 < uVar11) {
            if (*(int *)(pBVar15 + uVar27) == (int)lVar24) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar30 + 5),pBVar15 + (ulong)uVar27 + 4,iEnd,
                                  pBVar15 + uVar11,local_c8 + uVar11);
              uVar31 = sVar13 + 4;
LAB_001d60f1:
              if ((uVar35 < uVar31) &&
                 (local_120 = (ulong)((uVar32 + 2) - uVar27), uVar35 = uVar31,
                 (BYTE *)((long)plVar20 + uVar31) == iEnd)) break;
            }
          }
          else if ((local_c8 + uVar27)[uVar35] == *(BYTE *)((long)plVar20 + uVar35)) {
            uVar31 = ZSTD_count((BYTE *)plVar20,local_c8 + uVar27,iEnd);
            goto LAB_001d60f1;
          }
          uVar31 = uVar35;
          if (uVar27 <= uVar33) break;
          puVar14 = local_c0 + (uVar27 & uVar23 - 1);
        }
      }
      else if (uVar11 == 5) {
        bVar2 = (byte)(ms->cParams).chainLog;
        uVar23 = 1 << (bVar2 & 0x1f);
        uVar11 = (ms->window).dictLimit;
        UVar28 = (ms->window).lowLimit;
        local_f0 = (long)plVar20 - (long)local_c8;
        uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar32 = (uint)local_f0;
        UVar19 = uVar32 - uVar27;
        if (uVar32 - UVar28 <= uVar27) {
          UVar19 = UVar28;
        }
        if (ms->loadedDictEnd != 0) {
          UVar19 = UVar28;
        }
        uVar27 = (ms->cParams).searchLog;
        bVar17 = 0x40 - (char)(ms->cParams).hashLog;
        for (; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1) {
          uVar35 = (ulong)(*(long *)(local_c8 + uVar31) * -0x30e4432345000000) >> (bVar17 & 0x3f);
          local_c0[(uint)uVar31 & ~(-1 << (bVar2 & 0x1f))] = pUVar37[uVar35];
          pUVar37[uVar35] = (uint)uVar31;
        }
        uVar33 = uVar32 - uVar23;
        if (uVar32 < uVar23) {
          uVar33 = 0;
        }
        iVar10 = 1 << ((byte)uVar27 & 0x1f);
        ms->nextToUpdate = uVar32;
        lVar24 = *(long *)((long)plVar30 + 1);
        puVar14 = pUVar37 + ((ulong)(lVar24 * -0x30e4432345000000) >> (bVar17 & 0x3f));
        local_120 = 999999999;
        uVar35 = 3;
        while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, uVar31 = uVar35, bVar39) {
          uVar27 = *puVar14;
          if (uVar27 < UVar19) break;
          if (uVar27 < uVar11) {
            if (*(int *)(pBVar15 + uVar27) == (int)lVar24) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar30 + 5),pBVar15 + (ulong)uVar27 + 4,iEnd,
                                  pBVar15 + uVar11,local_c8 + uVar11);
              uVar31 = sVar13 + 4;
LAB_001d62c6:
              if ((uVar35 < uVar31) &&
                 (local_120 = (ulong)((uVar32 + 2) - uVar27), uVar35 = uVar31,
                 (BYTE *)((long)plVar20 + uVar31) == iEnd)) break;
            }
          }
          else if ((local_c8 + uVar27)[uVar35] == *(BYTE *)((long)plVar20 + uVar35)) {
            uVar31 = ZSTD_count((BYTE *)plVar20,local_c8 + uVar27,iEnd);
            goto LAB_001d62c6;
          }
          uVar31 = uVar35;
          if (uVar27 <= uVar33) break;
          puVar14 = local_c0 + (uVar27 & uVar23 - 1);
        }
      }
      else {
        bVar2 = (byte)(ms->cParams).chainLog;
        uVar23 = 1 << (bVar2 & 0x1f);
        uVar11 = (ms->window).dictLimit;
        UVar28 = (ms->window).lowLimit;
        local_f0 = (long)plVar20 - (long)local_c8;
        uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar32 = (uint)local_f0;
        UVar19 = uVar32 - uVar27;
        if (uVar32 - UVar28 <= uVar27) {
          UVar19 = UVar28;
        }
        if (ms->loadedDictEnd != 0) {
          UVar19 = UVar28;
        }
        uVar27 = (ms->cParams).searchLog;
        bVar17 = 0x20 - (char)(ms->cParams).hashLog;
        for (; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1) {
          uVar33 = (uint)(*(int *)(local_c8 + uVar31) * -0x61c8864f) >> (bVar17 & 0x1f);
          local_c0[(uint)uVar31 & ~(-1 << (bVar2 & 0x1f))] = pUVar37[uVar33];
          pUVar37[uVar33] = (uint)uVar31;
        }
        uVar33 = uVar32 - uVar23;
        if (uVar32 < uVar23) {
          uVar33 = 0;
        }
        iVar26 = 1 << ((byte)uVar27 & 0x1f);
        ms->nextToUpdate = uVar32;
        iVar10 = *(int *)((long)plVar30 + 1);
        puVar14 = pUVar37 + ((uint)(iVar10 * -0x61c8864f) >> (bVar17 & 0x1f));
        local_120 = 999999999;
        uVar35 = 3;
        while (bVar39 = iVar26 != 0, iVar26 = iVar26 + -1, uVar31 = uVar35, bVar39) {
          uVar27 = *puVar14;
          if (uVar27 < UVar19) break;
          if (uVar27 < uVar11) {
            if (*(int *)(pBVar15 + uVar27) == iVar10) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar30 + 5),pBVar15 + (ulong)uVar27 + 4,iEnd,
                                  pBVar15 + uVar11,local_c8 + uVar11);
              uVar31 = sVar13 + 4;
LAB_001d63f3:
              if ((uVar35 < uVar31) &&
                 (local_120 = (ulong)((uVar32 + 2) - uVar27), uVar35 = uVar31,
                 (BYTE *)((long)plVar20 + uVar31) == iEnd)) break;
            }
          }
          else if ((local_c8 + uVar27)[uVar35] == *(BYTE *)((long)plVar20 + uVar35)) {
            uVar31 = ZSTD_count((BYTE *)plVar20,local_c8 + uVar27,iEnd);
            goto LAB_001d63f3;
          }
          uVar31 = uVar35;
          if (uVar27 <= uVar33) break;
          puVar14 = local_c0 + (uVar27 & uVar23 - 1);
        }
      }
      if (uVar31 < 4) break;
      uVar23 = (int)local_110 + 1;
      uVar11 = 0x1f;
      if (uVar23 != 0) {
        for (; uVar23 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar23 = (int)local_120 + 1;
      iVar10 = 0x1f;
      if (uVar23 != 0) {
        for (; uVar23 >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      plVar30 = plVar20;
    } while ((int)((uVar11 ^ 0x1f) + (int)uVar34 * 4 + -0x1b) < (int)uVar31 * 4 - iVar10);
    if (local_110 == 0) {
      UVar28 = 1;
      uVar11 = UVar38;
    }
    else {
      pBVar21 = (BYTE *)((long)local_b8 + (-(long)pBVar5 - local_110) + 2);
      pBVar22 = iStart;
      pBVar15 = pBVar5;
      if ((uint)pBVar21 < uVar3) {
        pBVar22 = pBVar6 + uVar4;
        pBVar15 = pBVar6;
      }
      pBVar15 = pBVar15 + ((ulong)pBVar21 & 0xffffffff);
      for (; ((src < local_b8 && (pBVar22 < pBVar15)) &&
             (*(BYTE *)((long)local_b8 + -1) == pBVar15[-1]));
          local_b8 = (long *)((long)local_b8 + -1)) {
        pBVar15 = pBVar15 + -1;
        uVar34 = uVar34 + 1;
      }
      UVar28 = (int)local_110 + 1;
      uVar11 = (int)local_110 - 2;
      UVar25 = UVar38;
    }
    uVar31 = (long)local_b8 - (long)src;
    plVar30 = (long *)seqStore->lit;
    if (ilimit_w < local_b8) {
      ZSTD_safecopyLiterals((BYTE *)plVar30,(BYTE *)src,(BYTE *)local_b8,(BYTE *)ilimit_w);
LAB_001d6591:
      seqStore->lit = seqStore->lit + uVar31;
      psVar16 = seqStore->sequences;
      if (0xffff < uVar31) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      lVar24 = *(long *)((long)src + 8);
      *plVar30 = *src;
      plVar30[1] = lVar24;
      pBVar15 = seqStore->lit;
      if (0x10 < uVar31) {
        lVar24 = *(long *)((long)src + 0x18);
        *(long *)(pBVar15 + 0x10) = *(long *)((long)src + 0x10);
        *(long *)(pBVar15 + 0x18) = lVar24;
        if (0x20 < (long)uVar31) {
          lVar24 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar24 + 0x20);
            uVar7 = puVar1[1];
            pBVar22 = pBVar15 + lVar24 + 0x20;
            *(undefined8 *)pBVar22 = *puVar1;
            *(undefined8 *)(pBVar22 + 8) = uVar7;
            puVar1 = (undefined8 *)((long)src + lVar24 + 0x30);
            uVar7 = puVar1[1];
            *(undefined8 *)(pBVar22 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar22 + 0x18) = uVar7;
            lVar24 = lVar24 + 0x20;
          } while (pBVar22 + 0x20 < pBVar15 + uVar31);
        }
        goto LAB_001d6591;
      }
      seqStore->lit = pBVar15 + uVar31;
      psVar16 = seqStore->sequences;
    }
    psVar16->litLength = (U16)uVar31;
    psVar16->offset = UVar28;
    if (0xffff < uVar34 - 3) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar16->matchLength = (U16)(uVar34 - 3);
    seqStore->sequences = psVar16 + 1;
    for (plVar30 = (long *)((long)local_b8 + uVar34); UVar38 = uVar11, src = plVar30,
        plVar30 <= plVar12; plVar30 = (long *)((long)plVar30 + sVar13 + 4)) {
      iVar36 = (int)plVar30 - (int)pBVar5;
      UVar28 = (ms->window).lowLimit;
      UVar19 = iVar36 - uVar8;
      if (iVar36 - UVar28 <= uVar8) {
        UVar19 = UVar28;
      }
      if (ms->loadedDictEnd != 0) {
        UVar19 = UVar28;
      }
      uVar11 = iVar36 - UVar25;
      pBVar15 = pBVar5;
      if (uVar11 < uVar3) {
        pBVar15 = pBVar6;
      }
      if (((iVar9 - uVar11 < 3) || (iVar36 - UVar19 <= UVar25)) ||
         ((int)*plVar30 != *(int *)(pBVar15 + uVar11))) break;
      pBVar22 = iEnd;
      if (uVar11 < uVar3) {
        pBVar22 = pBVar29;
      }
      sVar13 = ZSTD_count_2segments
                         ((BYTE *)((long)plVar30 + 4),(BYTE *)((long)(pBVar15 + uVar11) + 4),iEnd,
                          pBVar22,iStart);
      plVar20 = (long *)seqStore->lit;
      if (ilimit_w < plVar30) {
        ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar30,(BYTE *)plVar30,(BYTE *)ilimit_w);
      }
      else {
        lVar24 = plVar30[1];
        *plVar20 = *plVar30;
        plVar20[1] = lVar24;
      }
      psVar16 = seqStore->sequences;
      psVar16->litLength = 0;
      psVar16->offset = 1;
      if (0xffff < sVar13 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar16->matchLength = (U16)(sVar13 + 1);
      seqStore->sequences = psVar16 + 1;
      uVar11 = UVar25;
      UVar25 = UVar38;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}